

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator=(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *other)

{
  if (this != other) {
    if ((this->super_RepeatedPtrFieldBase).arena_ == (other->super_RepeatedPtrFieldBase).arena_) {
      InternalSwap(this,other);
    }
    else {
      internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase);
      internal::RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
    }
  }
  return this;
}

Assistant:

inline RepeatedPtrField<Element>& RepeatedPtrField<Element>::operator=(
    RepeatedPtrField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (GetArena() != other.GetArena()
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
        || GetArena() == nullptr
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
    ) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}